

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

void __thiscall slang::ast::EvalContext::pushEmptyFrame(EvalContext *this)

{
  Frame *args;
  SmallVectorBase<slang::ast::EvalContext::Frame> *in_stack_ffffffffffffff98;
  Frame local_58;
  
  args = &local_58;
  local_58.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_58.temporaries._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_58.temporaries._M_t._M_impl._0_8_ = 0;
  local_58.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
  ::map((map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
         *)0x6f2747);
  local_58.subroutine = (SubroutineSymbol *)0x0;
  SourceLocation::SourceLocation(&local_58.callLocation);
  local_58.lookupLocation.scope = (Scope *)0x0;
  local_58.lookupLocation.index = 0;
  local_58.lookupLocation._12_4_ = 0;
  LookupLocation::LookupLocation(&local_58.lookupLocation);
  SmallVectorBase<slang::ast::EvalContext::Frame>::emplace_back<slang::ast::EvalContext::Frame>
            (in_stack_ffffffffffffff98,args);
  Frame::~Frame((Frame *)0x6f2788);
  return;
}

Assistant:

void EvalContext::pushEmptyFrame() {
    stack.emplace_back(Frame{});
}